

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall Omega_h::mark_image(Omega_h *this,LOs *a2b,LO nb)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_b8;
  undefined1 local_a8 [8];
  type f;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Write<signed_char> out;
  LO na;
  LO nb_local;
  LOs *a2b_local;
  ulong local_10;
  
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._0_4_ = (LO)(local_10 >> 2);
  out.shared_alloc_.direct_ptr._4_4_ = nb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Write<signed_char>::Write((Write<signed_char> *)local_50,nb,'\0',(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Read<int>::Read((Read<int> *)local_a8,a2b);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.a2b.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_50);
  parallel_for<Omega_h::mark_image(Omega_h::Read<int>,int)::__0>
            ((LO)out.shared_alloc_.direct_ptr,(type *)local_a8,"mark_image");
  Write<signed_char>::Write(&local_b8,(Write<signed_char> *)local_50);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_b8);
  Write<signed_char>::~Write(&local_b8);
  mark_image(Omega_h::Read<int>,int)::$_0::~__0((__0 *)local_a8);
  Write<signed_char>::~Write((Write<signed_char> *)local_50);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_image(LOs a2b, LO nb) {
  auto na = a2b.size();
  Write<I8> out(nb, 0);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    out[b] = 1;
  };
  parallel_for(na, f, "mark_image");
  return out;
}